

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int TIFFInitSGILog(TIFF *tif,int scheme)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint8_t *p;
  undefined1 auVar4 [16];
  
  if ((scheme & 0xfffffffeU) == 0x8774) {
    iVar3 = _TIFFMergeFields(tif,LogLuvFields,2);
    if (iVar3 == 0) {
      iVar3 = 0;
      TIFFErrorExtR(tif,"TIFFInitSGILog","Merging SGILog codec-specific tags failed");
    }
    else {
      p = (uint8_t *)_TIFFmallocExt(tif,0x38);
      tif->tif_data = p;
      if (p == (uint8_t *)0x0) {
        iVar3 = 0;
        TIFFErrorExtR(tif,"TIFFInitSGILog","%s: No space for LogLuv state block",tif->tif_name);
      }
      else {
        _TIFFmemset(p,0,0x38);
        p[4] = 0xff;
        p[5] = 0xff;
        p[6] = 0xff;
        p[7] = 0xff;
        *(uint *)(p + 8) = (uint)(scheme == 0x8775);
        *(code **)(p + 0x20) = _logLuvNop;
        tif->tif_fixuptags = LogLuvFixupTags;
        tif->tif_setupdecode = LogLuvSetupDecode;
        tif->tif_decodestrip = LogLuvDecodeStrip;
        tif->tif_decodetile = LogLuvDecodeTile;
        tif->tif_setupencode = LogLuvSetupEncode;
        tif->tif_encodestrip = LogLuvEncodeStrip;
        tif->tif_encodetile = LogLuvEncodeTile;
        tif->tif_close = LogLuvClose;
        tif->tif_cleanup = LogLuvCleanup;
        uVar1 = (tif->tif_tagmethods).vsetfield;
        uVar2 = (tif->tif_tagmethods).vgetfield;
        (tif->tif_tagmethods).vgetfield = LogLuvVGetField;
        auVar4._8_4_ = (int)uVar1;
        auVar4._0_8_ = uVar2;
        auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
        *(undefined1 (*) [16])(p + 0x28) = auVar4;
        (tif->tif_tagmethods).vsetfield = LogLuvVSetField;
        iVar3 = 1;
      }
    }
    return iVar3;
  }
  __assert_fail("scheme == COMPRESSION_SGILOG24 || scheme == COMPRESSION_SGILOG",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x6f9,"int TIFFInitSGILog(TIFF *, int)");
}

Assistant:

int TIFFInitSGILog(TIFF *tif, int scheme)
{
    static const char module[] = "TIFFInitSGILog";
    LogLuvState *sp;

    assert(scheme == COMPRESSION_SGILOG24 || scheme == COMPRESSION_SGILOG);

    /*
     * Merge codec-specific tag information.
     */
    if (!_TIFFMergeFields(tif, LogLuvFields, TIFFArrayCount(LogLuvFields)))
    {
        TIFFErrorExtR(tif, module, "Merging SGILog codec-specific tags failed");
        return 0;
    }

    /*
     * Allocate state block so tag methods have storage to record values.
     */
    tif->tif_data = (uint8_t *)_TIFFmallocExt(tif, sizeof(LogLuvState));
    if (tif->tif_data == NULL)
        goto bad;
    sp = (LogLuvState *)tif->tif_data;
    _TIFFmemset((void *)sp, 0, sizeof(*sp));
    sp->user_datafmt = SGILOGDATAFMT_UNKNOWN;
    sp->encode_meth = (scheme == COMPRESSION_SGILOG24) ? SGILOGENCODE_RANDITHER
                                                       : SGILOGENCODE_NODITHER;
    sp->tfunc = _logLuvNop;

    /*
     * Install codec methods.
     * NB: tif_decoderow & tif_encoderow are filled
     *     in at setup time.
     */
    tif->tif_fixuptags = LogLuvFixupTags;
    tif->tif_setupdecode = LogLuvSetupDecode;
    tif->tif_decodestrip = LogLuvDecodeStrip;
    tif->tif_decodetile = LogLuvDecodeTile;
    tif->tif_setupencode = LogLuvSetupEncode;
    tif->tif_encodestrip = LogLuvEncodeStrip;
    tif->tif_encodetile = LogLuvEncodeTile;
    tif->tif_close = LogLuvClose;
    tif->tif_cleanup = LogLuvCleanup;

    /*
     * Override parent get/set field methods.
     */
    sp->vgetparent = tif->tif_tagmethods.vgetfield;
    tif->tif_tagmethods.vgetfield = LogLuvVGetField; /* hook for codec tags */
    sp->vsetparent = tif->tif_tagmethods.vsetfield;
    tif->tif_tagmethods.vsetfield = LogLuvVSetField; /* hook for codec tags */

    return (1);
bad:
    TIFFErrorExtR(tif, module, "%s: No space for LogLuv state block",
                  tif->tif_name);
    return (0);
}